

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::BinaryExpression::fromComponents
          (Expression *lhs,Expression *rhs,BinaryOperator op,SourceRange opRange,
          SourceRange sourceRange,ASTContext *context)

{
  Compilation *pCVar1;
  SourceLocation SVar2;
  ExpressionSyntax *pEVar3;
  SourceRange sourceRange_00;
  SourceRange opRange_00;
  SourceRange opRange_01;
  SourceRange opRange_02;
  SourceRange opRange_03;
  SourceRange opRange_04;
  SourceRange opRange_05;
  SourceRange opRange_06;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> extraDiagArg;
  SourceRange sourceRange_01;
  SourceRange range;
  SourceRange sourceRange_02;
  BinaryExpression *pBVar4;
  undefined1 uVar5;
  Symbol *pSVar6;
  Scope *pSVar7;
  SourceLocation SVar8;
  bool bVar9;
  bool bVar10;
  bitwidth_t bVar11;
  BinaryExpression *pBVar12;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  Compilation *pCVar13;
  undefined7 extraout_var_01;
  Type *pTVar14;
  undefined7 extraout_var_02;
  int *piVar15;
  Diagnostic *pDVar16;
  Diagnostic *pDVar17;
  int iVar18;
  long lVar19;
  BinaryExpression *pBVar20;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  Type *forceType;
  Type *extraout_RDX_01;
  Type *extraout_RDX_02;
  SourceLocation SVar21;
  undefined1 op_00 [4];
  Type *pTVar22;
  char *pcVar23;
  DiagCode code;
  ConversionKind conversionKind;
  Compilation *this;
  Compilation *compilation;
  ulong uVar24;
  size_t sVar25;
  UnaryExpression *unary;
  string_view arg;
  string_view arg_00;
  SourceRange range_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view sVar26;
  SourceRange sourceRange_03;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  Type *lt;
  Type *rt;
  anon_class_24_3_e32f0a13 warnAWithinB;
  anon_class_24_3_21991733 check;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
  *args_5;
  undefined4 uVar27;
  SourceLocation in_stack_fffffffffffffe90;
  undefined1 local_129;
  undefined8 local_128;
  Type *local_120;
  BinaryExpression *local_118;
  BinaryExpression *local_110;
  SourceLocation local_108;
  undefined1 local_fc [4];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
  local_f8;
  BinaryOperator local_dc;
  char *local_d8;
  Compilation *local_d0;
  BinaryExpression *local_c8;
  Compilation *local_c0;
  SourceLocation local_b8;
  SourceLocation local_b0;
  SourceLocation local_a8;
  Scope *local_a0;
  Type *local_98;
  Type *pTStack_90;
  Type *local_88;
  SourceLocation local_80;
  SourceLocation local_78;
  anon_class_64_8_451f4118 local_70;
  
  local_f8.first._M_str = (char *)opRange.endLoc;
  local_f8.first._M_len = (size_t)opRange.startLoc;
  args_5 = &local_f8;
  pCVar1 = ((context->scope).ptr)->compilation;
  compilation = (Compilation *)(lhs->type).ptr;
  this = (Compilation *)(rhs->type).ptr;
  local_120 = (Type *)context;
  local_dc = op;
  local_d0 = compilation;
  local_c0 = this;
  pBVar12 = BumpAllocator::
            emplace<slang::ast::BinaryExpression,slang::ast::BinaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&,slang::SourceRange&>
                      (&pCVar1->super_BumpAllocator,&local_dc,(Type *)compilation,lhs,rhs,
                       &sourceRange,(SourceRange *)args_5);
  local_118 = pBVar12;
  bVar9 = Expression::bad(lhs);
  if ((bVar9) || (bVar9 = Expression::bad(rhs), bVar9)) goto LAB_004d28d6;
  piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
  local_f8.second = (Symbol *)rhs;
  if (piVar15 == (int *)0x0) {
    Type::resolveCanonical((Type *)compilation);
    piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
  }
  if (*piVar15 == 0x1d) {
    compilation = (Compilation *)pCVar1->intType;
    local_d0 = compilation;
  }
  piVar15 = *(int **)&(this->options).typoCorrectionLimit;
  if (piVar15 == (int *)0x0) {
    Type::resolveCanonical((Type *)this);
    piVar15 = *(int **)&(this->options).typoCorrectionLimit;
  }
  if (*piVar15 == 0x1d) {
    this = (Compilation *)pCVar1->intType;
    local_c0 = this;
  }
  bVar9 = Type::isIntegral((Type *)compilation);
  if (bVar9) {
    bVar9 = Type::isIntegral((Type *)this);
    local_108._0_4_ = (int)CONCAT71(extraout_var,bVar9);
  }
  else {
    local_108 = (SourceLocation)((ulong)(uint)local_108._4_4_ << 0x20);
  }
  bVar9 = Type::isNumeric((Type *)compilation);
  if (bVar9) {
    bVar9 = Type::isNumeric((Type *)this);
    local_128 = (Type *)CONCAT44(local_128._4_4_,(int)CONCAT71(extraout_var_00,bVar9));
  }
  else {
    local_128 = (Type *)((ulong)local_128._4_4_ << 0x20);
  }
  local_110 = pBVar12;
  bVar9 = Expression::isImplicitString(lhs);
  if (bVar9) {
    bVar9 = Expression::isImplicitString((Expression *)local_f8.second);
    pTVar14 = extraout_RDX_00;
  }
  else {
    bVar9 = false;
    pTVar14 = extraout_RDX;
  }
  pBVar20 = local_110;
  pBVar12 = local_118;
  uVar27 = (undefined4)((ulong)args_5 >> 0x20);
  pTVar22 = (Type *)(ulong)local_dc;
  if ((Type *)0x1b < pTVar22) goto LAB_004d3791;
  lVar19 = (long)&switchD_004d29d2::switchdataD_00563d3c +
           (long)(int)(&switchD_004d29d2::switchdataD_00563d3c)[(long)pTVar22];
  switch(pTVar22) {
  case (Type *)0x0:
  case (Type *)0x1:
  case (Type *)0x2:
    bVar9 = false;
    break;
  case (Type *)0x3:
    bVar9 = true;
    break;
  case (Type *)0x4:
    bVar9 = true;
    goto LAB_004d2f7f;
  case (Type *)0x5:
  case (Type *)0x6:
  case (Type *)0x7:
  case (Type *)0x8:
    bVar9 = false;
LAB_004d2f7f:
    pTVar14 = OpInfo::binaryType(pCVar1,(Type *)compilation,(Type *)this,bVar9,false);
    (local_110->super_Expression).type.ptr = pTVar14;
LAB_004d2f90:
    uVar5 = local_108._0_1_;
    goto joined_r0x004d2f95;
  default:
    if ((undefined1)local_128 == Unknown >> 8) {
      if (bVar9 == false) {
        bVar9 = Type::isAggregate((Type *)compilation);
        pBVar12 = local_110;
        if ((!bVar9) || (bVar9 = Type::isEquivalent((Type *)compilation,(Type *)this), !bVar9)) {
          piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
          if (piVar15 == (int *)0x0) {
            Type::resolveCanonical((Type *)compilation);
            piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
          }
          if ((*piVar15 != 0x16) ||
             (bVar9 = Type::isAssignmentCompatible((Type *)compilation,(Type *)this), !bVar9)) {
            piVar15 = *(int **)&(this->options).typoCorrectionLimit;
            if (piVar15 == (int *)0x0) {
              Type::resolveCanonical((Type *)this);
              piVar15 = *(int **)&(this->options).typoCorrectionLimit;
            }
            if ((*piVar15 != 0x16) ||
               (bVar9 = Type::isAssignmentCompatible((Type *)this,(Type *)compilation), !bVar9)) {
              piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
              if (piVar15 == (int *)0x0) {
                Type::resolveCanonical((Type *)compilation);
                piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
              }
              iVar18 = *piVar15;
              if (iVar18 - 0x19U < 2) {
                piVar15 = *(int **)&(this->options).typoCorrectionLimit;
                if (piVar15 == (int *)0x0) {
                  Type::resolveCanonical((Type *)this);
                  piVar15 = *(int **)&(this->options).typoCorrectionLimit;
                }
                if (*piVar15 - 0x19U < 2) goto LAB_004d2f3f;
                piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
                if (piVar15 == (int *)0x0) {
                  Type::resolveCanonical((Type *)compilation);
                  piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
                }
                iVar18 = *piVar15;
              }
              if ((iVar18 == 0x1c) || (iVar18 == 0x19)) {
                piVar15 = *(int **)&(this->options).typoCorrectionLimit;
                if (piVar15 == (int *)0x0) {
                  Type::resolveCanonical((Type *)this);
                  piVar15 = *(int **)&(this->options).typoCorrectionLimit;
                }
                if ((*piVar15 == 0x19) || (*piVar15 == 0x1c)) goto LAB_004d2f3f;
                piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
                if (piVar15 == (int *)0x0) {
                  Type::resolveCanonical((Type *)compilation);
                  piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
                }
              }
              iVar18 = *piVar15;
              if ((iVar18 == 0x19) || (iVar18 == 0x17)) {
                piVar15 = *(int **)&(this->options).typoCorrectionLimit;
                if (piVar15 == (int *)0x0) {
                  Type::resolveCanonical((Type *)this);
                  piVar15 = *(int **)&(this->options).typoCorrectionLimit;
                }
                if ((*piVar15 == 0x17) || (*piVar15 == 0x19)) goto LAB_004d2f3f;
                piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
                if (piVar15 == (int *)0x0) {
                  Type::resolveCanonical((Type *)compilation);
                  piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
                }
                iVar18 = *piVar15;
              }
              if ((iVar18 != 0x22) ||
                 (bVar9 = Type::isAssignmentCompatible((Type *)compilation,(Type *)this), !bVar9)) {
                piVar15 = *(int **)&(this->options).typoCorrectionLimit;
                if (piVar15 == (int *)0x0) {
                  Type::resolveCanonical((Type *)this);
                  piVar15 = *(int **)&(this->options).typoCorrectionLimit;
                }
                if ((*piVar15 != 0x22) ||
                   (bVar9 = Type::isAssignmentCompatible((Type *)this,(Type *)compilation), !bVar9))
                {
                  piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
                  if (piVar15 == (int *)0x0) {
                    Type::resolveCanonical((Type *)compilation);
                    piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
                  }
                  if (*piVar15 == 0x1e) {
                    piVar15 = *(int **)&(this->options).typoCorrectionLimit;
                    if (piVar15 == (int *)0x0) {
                      Type::resolveCanonical((Type *)this);
                      piVar15 = *(int **)&(this->options).typoCorrectionLimit;
                    }
                    lVar19 = 0x148;
                    if (*piVar15 == 0x1e) goto LAB_004d2cd3;
                  }
                  pBVar12 = local_118;
                  pTVar14 = local_120;
                  Expression::selfDetermined((ASTContext *)local_120,&local_118->left_);
                  Expression::selfDetermined((ASTContext *)pTVar14,&pBVar12->right_);
                  goto LAB_004d3791;
                }
              }
            }
          }
LAB_004d2f3f:
          pBVar20 = local_118;
          pTVar14 = local_120;
          (pBVar12->super_Expression).type.ptr = pCVar1->bitType;
          Expression::selfDetermined((ASTContext *)local_120,&local_118->left_);
          Expression::selfDetermined((ASTContext *)pTVar14,&pBVar20->right_);
          goto LAB_004d2fc6;
        }
        bVar9 = Type::isFourState((Type *)compilation);
        lVar19 = 0x150;
        if (!bVar9) {
          bVar9 = Type::isFourState((Type *)this);
          lVar19 = (ulong)bVar9 * 8 + 0x148;
        }
LAB_004d2cd3:
        pBVar20 = local_118;
        pTVar14 = local_120;
        (pBVar12->super_Expression).type.ptr =
             *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar19);
        local_128 = pTVar22;
        Expression::selfDetermined((ASTContext *)local_120,&local_118->left_);
        Expression::selfDetermined((ASTContext *)pTVar14,&pBVar20->right_);
      }
      else {
        (local_110->super_Expression).type.ptr = pCVar1->bitType;
        opRange_00.startLoc._4_4_ = uVar27;
        opRange_00.startLoc._0_4_ = 1;
        opRange_00.endLoc = in_stack_fffffffffffffe90;
        local_128 = pTVar22;
        Expression::contextDetermined
                  ((Expression *)local_120,(ASTContext *)&local_118->left_,(Expression **)local_110,
                   (Expression *)pCVar1->stringType,(Type *)local_f8.first._M_len,opRange_00,
                   (ConversionKind)local_f8.first._M_str);
        opRange_01.startLoc._4_4_ = uVar27;
        opRange_01.startLoc._0_4_ = 1;
        opRange_01.endLoc = in_stack_fffffffffffffe90;
        Expression::contextDetermined
                  ((Expression *)local_120,(ASTContext *)&pBVar12->right_,(Expression **)pBVar20,
                   (Expression *)pCVar1->stringType,(Type *)local_f8.first._M_len,opRange_01,
                   (ConversionKind)local_f8.first._M_str);
      }
      if ((uint)local_128 < 0x11) goto LAB_004d2fc6;
      goto LAB_004d3791;
    }
    if (local_dc - Equality < 2) {
      bVar9 = Type::isFourState((Type *)compilation);
      local_108._0_4_ = (int)CONCAT71((int7)((ulong)lVar19 >> 8),1);
      lVar19 = 0x150;
      pCVar13 = this;
      pBVar20 = local_110;
      if (!bVar9) {
LAB_004d2d16:
        pBVar20 = local_110;
        bVar9 = Type::isFourState((Type *)pCVar13);
        lVar19 = (ulong)bVar9 * 8 + 0x148;
      }
    }
    else {
      pCVar13 = compilation;
      if (1 < local_dc - CaseEquality) goto LAB_004d2d16;
      local_108._0_4_ = (int)CONCAT71((uint7)(uint3)(local_dc - Equality >> 8),1);
      lVar19 = 0x148;
    }
    (pBVar20->super_Expression).type.ptr =
         *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar19);
    local_128 = OpInfo::binaryType(pCVar1,(Type *)compilation,(Type *)this,false,false);
    pBVar12 = local_118;
    pTVar14 = local_120;
    opRange_03.startLoc._4_4_ = uVar27;
    opRange_03.startLoc._0_4_ = 1;
    opRange_03.endLoc = in_stack_fffffffffffffe90;
    Expression::contextDetermined
              ((Expression *)local_120,(ASTContext *)&local_118->left_,(Expression **)pBVar20,
               (Expression *)local_128,(Type *)local_f8.first._M_len,opRange_03,
               (ConversionKind)local_f8.first._M_str);
    conversionKind = (ConversionKind)local_f8.first._M_str;
    pBVar20 = local_110;
    goto LAB_004d2da2;
  case (Type *)0xd:
  case (Type *)0xe:
  case (Type *)0xf:
  case (Type *)0x10:
    bVar10 = Type::isFourState((Type *)compilation);
    lVar19 = 0x150;
    if (!bVar10) {
      bVar10 = Type::isFourState((Type *)this);
      lVar19 = (ulong)bVar10 * 8 + 0x148;
    }
    local_108._0_1_ = (byte)local_128 | bVar9;
    (local_110->super_Expression).type.ptr =
         *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar19);
    if (bVar9 == true && (byte)local_128 == 0) {
      local_128 = pCVar1->stringType;
    }
    else {
      local_128 = OpInfo::binaryType(pCVar1,(Type *)compilation,(Type *)this,false,false);
    }
    pBVar20 = local_110;
    pBVar12 = local_118;
    opRange_02.startLoc._4_4_ = uVar27;
    opRange_02.startLoc._0_4_ = 1;
    opRange_02.endLoc = in_stack_fffffffffffffe90;
    Expression::contextDetermined
              ((Expression *)local_120,(ASTContext *)&local_118->left_,(Expression **)local_110,
               (Expression *)local_128,(Type *)local_f8.first._M_len,opRange_02,
               (ConversionKind)local_f8.first._M_str);
    conversionKind = (ConversionKind)local_f8.first._M_str;
    pTVar14 = local_120;
LAB_004d2da2:
    opRange_04.startLoc._4_4_ = uVar27;
    opRange_04.startLoc._0_4_ = 1;
    opRange_04.endLoc = in_stack_fffffffffffffe90;
    Expression::contextDetermined
              ((Expression *)pTVar14,(ASTContext *)&pBVar12->right_,(Expression **)pBVar20,
               (Expression *)local_128,(Type *)local_f8.first._M_len,opRange_04,conversionKind);
    goto LAB_004d2f90;
  case (Type *)0x13:
  case (Type *)0x14:
  case (Type *)0x15:
  case (Type *)0x16:
    bVar9 = Type::isFourState((Type *)compilation);
    lVar19 = 0x150;
    if (!bVar9) {
      bVar9 = Type::isFourState((Type *)this);
      lVar19 = (ulong)bVar9 * 8 + 0x148;
    }
    pBVar12 = local_118;
    pTVar14 = local_120;
    (local_110->super_Expression).type.ptr =
         *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar19);
    local_108 = (SourceLocation)&local_118->left_;
    Expression::selfDetermined((ASTContext *)local_120,(Expression **)local_108);
    local_118 = (BinaryExpression *)&pBVar12->right_;
    Expression::selfDetermined((ASTContext *)pTVar14,(Expression **)local_118);
    pTVar14 = local_120;
    if ((undefined1)local_128 == Unknown >> 8) goto LAB_004d3791;
    ASTContext::requireBooleanConvertible((ASTContext *)local_120,*(Expression **)local_108);
    ASTContext::requireBooleanConvertible
              ((ASTContext *)pTVar14,*(Expression **)&local_118->super_Expression);
    goto LAB_004d2fc6;
  case (Type *)0x17:
  case (Type *)0x18:
  case (Type *)0x19:
  case (Type *)0x1a:
    bVar9 = Type::isFourState((Type *)this);
    pCVar13 = compilation;
    if (bVar9) {
      pCVar13 = (Compilation *)
                fromComponents::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)pCVar1,compilation,forceType);
    }
    (local_110->super_Expression).type.ptr = (Type *)pCVar13;
    Expression::selfDetermined((ASTContext *)local_120,&local_118->right_);
    goto LAB_004d2f90;
  case (Type *)0x1b:
    piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
    if (piVar15 == (int *)0x0) {
      Type::resolveCanonical((Type *)compilation);
      piVar15 = *(int **)&(compilation->options).typoCorrectionLimit;
      pTVar14 = extraout_RDX_01;
    }
    pBVar12 = local_110;
    uVar27 = (undefined4)((ulong)args_5 >> 0x20);
    if (*piVar15 == 9) {
LAB_004d30fd:
      pTVar14 = OpInfo::binaryType(pCVar1,(Type *)compilation,(Type *)this,false,false);
      (pBVar12->super_Expression).type.ptr = pTVar14;
      opRange_05.startLoc._4_4_ = uVar27;
      opRange_05.startLoc._0_4_ = 1;
      opRange_05.endLoc = in_stack_fffffffffffffe90;
      Expression::contextDetermined
                ((Expression *)local_120,(ASTContext *)&local_118->right_,(Expression **)pBVar12,
                 (Expression *)pTVar14,(Type *)local_f8.first._M_len,opRange_05,
                 (ConversionKind)local_f8.first._M_str);
    }
    else {
      piVar15 = *(int **)&(this->options).typoCorrectionLimit;
      if (piVar15 == (int *)0x0) {
        Type::resolveCanonical((Type *)this);
        piVar15 = *(int **)&(this->options).typoCorrectionLimit;
        pTVar14 = extraout_RDX_02;
      }
      uVar27 = (undefined4)((ulong)args_5 >> 0x20);
      if (*piVar15 == 9) goto LAB_004d30fd;
      pTVar14 = fromComponents::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)pCVar1,compilation,pTVar14);
      (pBVar12->super_Expression).type.ptr = pTVar14;
      Expression::selfDetermined((ASTContext *)local_120,&local_118->right_);
    }
    goto LAB_004d2fbb;
  }
  pTVar14 = OpInfo::binaryType(pCVar1,(Type *)compilation,(Type *)this,bVar9,false);
  (local_110->super_Expression).type.ptr = pTVar14;
LAB_004d2fbb:
  uVar5 = (undefined1)local_128;
joined_r0x004d2f95:
  if (uVar5 == Unknown >> 8) {
LAB_004d3791:
    sourceRange_01.endLoc = (SourceLocation)local_f8.first._M_str;
    sourceRange_01.startLoc = (SourceLocation)local_f8.first._M_len;
    pDVar16 = ASTContext::addDiag((ASTContext *)local_120,(DiagCode)0x1f0007,sourceRange_01);
    pDVar17 = ast::operator<<(pDVar16,(Type *)compilation);
    ast::operator<<(pDVar17,(Type *)this);
    Diagnostic::operator<<(pDVar16,lhs->sourceRange);
    Diagnostic::operator<<(pDVar16,((Expression *)&(local_f8.second)->kind)->sourceRange);
    pBVar12 = local_110;
LAB_004d28d6:
    local_110 = (BinaryExpression *)Expression::badExpr(pCVar1,&pBVar12->super_Expression);
  }
  else {
LAB_004d2fc6:
    op_00 = (undefined1  [4])local_dc;
    pcVar23 = local_f8.first._M_str;
    local_b8 = (SourceLocation)local_f8.first._M_len;
    local_b0 = (SourceLocation)local_f8.first._M_str;
    local_fc = (undefined1  [4])local_dc;
    if (lhs->kind != LValueReference) {
      local_108 = (SourceLocation)local_f8.first._M_len;
      bVar9 = OpInfo::isBitwise(local_dc);
      if (bVar9) {
        bVar9 = Expression::isParenthesized(lhs);
        pSVar6 = local_f8.second;
        bVar10 = false;
        pBVar12 = (BinaryExpression *)0x0;
        if (lhs->kind == BinaryOp) {
          pBVar12 = (BinaryExpression *)lhs;
        }
        if (bVar9) {
          pBVar12 = (BinaryExpression *)0x0;
        }
        bVar9 = Expression::isParenthesized((Expression *)local_f8.second);
        pBVar20 = (BinaryExpression *)0x0;
        if (((Expression *)&pSVar6->kind)->kind == BinaryOp) {
          pBVar20 = (BinaryExpression *)pSVar6;
        }
        if (bVar9) {
          pBVar20 = (BinaryExpression *)0x0;
        }
        local_118 = pBVar12;
        if (pBVar12 == (BinaryExpression *)0x0) {
          local_128 = (Type *)0x0;
        }
        else {
          bVar9 = OpInfo::isComparison(pBVar12->op);
          local_128 = (Type *)CONCAT71(extraout_var_01,bVar9);
        }
        if (pBVar20 != (BinaryExpression *)0x0) {
          bVar10 = OpInfo::isComparison(pBVar20->op);
        }
        if (bVar10 != (bool)(undefined1)local_128) {
          if (local_118 == (BinaryExpression *)0x0) {
            bVar9 = false;
          }
          else {
            bVar9 = OpInfo::isBitwise(local_118->op);
          }
          if (pBVar20 == (BinaryExpression *)0x0) {
            uVar24 = 0;
          }
          else {
            bVar10 = OpInfo::isBitwise(pBVar20->op);
            uVar24 = CONCAT71(extraout_var_02,bVar10) & 0xffffffff;
          }
          bVar10 = Type::isIntegral((lhs->type).ptr);
          if ((bVar10) &&
             (bVar11 = Type::getBitWidth((lhs->type).ptr), pSVar6 = local_f8.second, bVar11 == 1)) {
            local_d8 = (char *)CONCAT44(local_d8._4_4_,(int)uVar24);
            bVar10 = Type::isIntegral((((Expression *)&(local_f8.second)->kind)->type).ptr);
            if (bVar10) {
              bVar11 = Type::getBitWidth((((Expression *)&pSVar6->kind)->type).ptr);
              bVar10 = bVar11 == 1;
            }
            else {
              bVar10 = false;
            }
            uVar24 = (ulong)local_d8 & 0xffffffff;
          }
          else {
            bVar10 = false;
          }
          if ((bVar9 == false && (char)uVar24 == '\0') && (!bVar10)) {
            sVar26 = OpInfo::getText((BinaryOperator)op_00);
            local_d8 = sVar26._M_str;
            local_a8 = (SourceLocation)sVar26._M_len;
            local_80 = (SourceLocation)&lhs->sourceRange;
            pBVar12 = pBVar20;
            if ((undefined1)local_128 != Unknown >> 8) {
              pBVar12 = local_118;
            }
            local_c8 = (BinaryExpression *)&((Expression *)&(local_f8.second)->kind)->sourceRange;
            pBVar4 = (BinaryExpression *)local_f8.second;
            if ((undefined1)local_128 != Unknown >> 8) {
              local_c8 = (BinaryExpression *)local_80;
              pBVar4 = (BinaryExpression *)lhs;
            }
            sVar26 = OpInfo::getText(pBVar12->op);
            arg._M_str = (SourceLocation)sVar26._M_str;
            local_a0 = (Scope *)sVar26._M_len;
            local_78 = (pBVar4->super_Expression).sourceRange.startLoc;
            SVar2 = *(SourceLocation *)((long)local_c8 + 8);
            sourceRange_03.endLoc = (SourceLocation)pcVar23;
            sourceRange_03.startLoc = local_108;
            pDVar16 = ASTContext::addDiag((ASTContext *)local_120,(DiagCode)0xb80007,sourceRange_03)
            ;
            sVar26._M_str = local_d8;
            sVar26._M_len = (size_t)local_a8;
            local_c8 = pBVar20;
            pDVar17 = Diagnostic::operator<<(pDVar16,sVar26);
            pSVar7 = local_a0;
            arg._M_len = (size_t)local_a0;
            pDVar17 = Diagnostic::operator<<(pDVar17,arg);
            SVar8 = local_78;
            arg_00._M_str = (char *)arg._M_str;
            arg_00._M_len = (size_t)pSVar7;
            local_108 = arg._M_str;
            pDVar17 = Diagnostic::operator<<(pDVar17,arg_00);
            range_00.endLoc = SVar2;
            range_00.startLoc = SVar8;
            Diagnostic::operator<<(pDVar17,range_00);
            if ((undefined1)local_128 == Unknown >> 8) {
              pBVar12 = (BinaryExpression *)local_c8->left_;
              SVar21 = local_80;
            }
            else {
              pBVar12 = (BinaryExpression *)local_f8.second;
              SVar21 = (SourceLocation)&local_118->right_->sourceRange;
            }
            range_01.endLoc = (pBVar12->super_Expression).sourceRange.endLoc;
            range_01.startLoc = *(SourceLocation *)SVar21;
            pDVar17 = Diagnostic::addNote(pDVar16,(DiagCode)0xb20007,range_01);
            arg_01._M_str = local_d8;
            arg_01._M_len = (size_t)local_a8;
            Diagnostic::operator<<(pDVar17,arg_01);
            range_02.endLoc = SVar2;
            range_02.startLoc = SVar8;
            pDVar16 = Diagnostic::addNote(pDVar16,(DiagCode)0xb30007,range_02);
            arg_02._M_str = (char *)local_108;
            arg_02._M_len = (size_t)local_a0;
            Diagnostic::operator<<(pDVar16,arg_02);
          }
        }
      }
      pSVar6 = local_f8.second;
      local_98 = local_120;
      pTStack_90 = (Type *)local_fc;
      local_88 = (Type *)&local_b8;
      if ((int)op_00 - BinaryOr < 3) {
        local_70.clt = (Type *)&local_129;
        local_70.lt = &local_98;
        local_70.crt = (Type *)local_fc;
        analyzePrecedence::anon_class_24_3_21991733::operator()
                  ((anon_class_24_3_21991733 *)&local_70,lhs);
        analyzePrecedence::anon_class_24_3_21991733::operator()
                  ((anon_class_24_3_21991733 *)&local_70,(Expression *)pSVar6);
        op_00 = local_fc;
      }
      if (op_00 == (undefined1  [4])0x14) {
        local_70.clt = (Type *)&local_129;
        local_70.crt = (Type *)&local_98;
        analyzePrecedence::anon_class_16_2_3ed4ffe4::operator()
                  ((anon_class_16_2_3ed4ffe4 *)&local_70,lhs);
        analyzePrecedence::anon_class_16_2_3ed4ffe4::operator()
                  ((anon_class_16_2_3ed4ffe4 *)&local_70,(Expression *)pSVar6);
        op_00 = local_fc;
      }
      bVar9 = OpInfo::isShift((BinaryOperator)op_00);
      if (bVar9) {
        local_70.clt = (Type *)&local_129;
        local_70.crt = local_120;
        local_70.lt = (Type **)local_fc;
        local_70.rt = (Type **)&local_b8;
        analyzePrecedence::anon_class_32_4_55ae12ec::operator()
                  ((anon_class_32_4_55ae12ec *)&local_70,lhs);
        analyzePrecedence::anon_class_32_4_55ae12ec::operator()
                  ((anon_class_32_4_55ae12ec *)&local_70,(Expression *)pSVar6);
      }
      bVar9 = OpInfo::isComparison((BinaryOperator)local_fc);
      if ((((local_fc == (undefined1  [4])0x5 || bVar9) && (lhs->kind == UnaryOp)) &&
          (bVar9 = Expression::isParenthesized(lhs), !bVar9)) && (lhs[1].kind == HierarchicalValue))
      {
        pEVar3 = lhs[1].syntax;
        bVar9 = Type::isIntegral((Type *)(pEVar3->super_SyntaxNode).parent);
        if (((!bVar9) ||
            (bVar11 = Type::getBitWidth((Type *)(pEVar3->super_SyntaxNode).parent), bVar11 != 1)) &&
           ((bVar9 = Type::isIntegral((((Expression *)&pSVar6->kind)->type).ptr), !bVar9 ||
            (bVar11 = Type::getBitWidth((((Expression *)&pSVar6->kind)->type).ptr), bVar11 != 1))))
        {
          pcVar23 = "comparison";
          if (local_fc == (undefined1  [4])0x5) {
            pcVar23 = "bitwise operator";
          }
          sVar25 = 10;
          if (local_fc == (undefined1  [4])0x5) {
            sVar25 = 0x10;
          }
          sourceRange_00.startLoc = *(SourceLocation *)&lhs[1].type;
          sourceRange_00.endLoc = (SourceLocation)lhs[1].constant;
          pDVar16 = ASTContext::addDiag((ASTContext *)local_120,(DiagCode)0xc80007,sourceRange_00);
          arg_03._M_str = pcVar23;
          arg_03._M_len = sVar25;
          pDVar17 = Diagnostic::operator<<(pDVar16,arg_03);
          range.endLoc = local_b0;
          range.startLoc = local_b8;
          Diagnostic::operator<<(pDVar17,range);
          range_03.endLoc = (((Expression *)&pSVar6->kind)->sourceRange).endLoc;
          range_03.startLoc = (SourceLocation)lhs[1].syntax[1].super_SyntaxNode.parent;
          pDVar17 = Diagnostic::addNote(pDVar16,(DiagCode)0xb00007,range_03);
          arg_04._M_str = pcVar23;
          arg_04._M_len = sVar25;
          Diagnostic::operator<<(pDVar17,arg_04);
          Diagnostic::addNote(pDVar16,(DiagCode)0xb10007,lhs->sourceRange);
        }
      }
      bVar9 = OpInfo::isRelational((BinaryOperator)local_fc);
      compilation = local_d0;
      if (((bVar9) && (bVar9 = Expression::isParenthesized(lhs), compilation = local_d0, !bVar9)) &&
         ((lhs->kind == BinaryOp &&
          (bVar9 = OpInfo::isRelational(*(BinaryOperator *)&lhs[1].constant), compilation = local_d0
          , bVar9)))) {
        sourceRange_02.endLoc = local_b0;
        sourceRange_02.startLoc = local_b8;
        ASTContext::addDiag((ASTContext *)local_120,(DiagCode)0xbd0007,sourceRange_02);
        compilation = local_d0;
      }
    }
    pTVar14 = *(Type **)&(compilation->options).typoCorrectionLimit;
    if (pTVar14 == (Type *)0x0) {
      Type::resolveCanonical((Type *)compilation);
      pTVar14 = *(Type **)&(compilation->options).typoCorrectionLimit;
    }
    pCVar1 = local_c0;
    pSVar6 = local_f8.second;
    pTVar22 = *(Type **)&(local_c0->options).typoCorrectionLimit;
    if (pTVar22 == (Type *)0x0) {
      Type::resolveCanonical((Type *)local_c0);
      pTVar22 = *(Type **)&(pCVar1->options).typoCorrectionLimit;
    }
    bVar9 = Type::isMatching(pTVar14,pTVar22);
    if (!bVar9) {
      local_70.lt = (Type **)&local_d0;
      local_70.rt = (Type **)&local_c0;
      local_70.rhs = (Expression *)pSVar6;
      local_70.context = (ASTContext *)local_120;
      local_70.opRange = (SourceRange *)&local_f8;
      if (local_dc < LogicalAnd) {
        local_70.clt = pTVar14;
        local_70.crt = pTVar22;
        local_70.lhs = lhs;
        if ((0x7fe00U >> (local_dc & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
          if ((0x1fU >> (local_dc & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
            code.subsystem = Expressions;
            code.code = 0xb6;
          }
          else {
            code.subsystem = Expressions;
            code.code = 0xb5;
          }
          fromComponents::anon_class_64_8_451f4118::operator()(&local_70,code,false);
        }
        else {
          local_88 = (Type *)((ulong)local_88 & 0xffffffffffffff00);
          opRange_06.endLoc = (SourceLocation)local_f8.first._M_str;
          opRange_06.startLoc = (SourceLocation)local_f8.first._M_len;
          extraDiagArg.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._M_value._M_str = (char *)pTStack_90;
          extraDiagArg.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._M_value._M_len = (size_t)local_98;
          extraDiagArg.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _16_8_ = local_88;
          analyzeOpTypes(pTVar14,pTVar22,(Type *)local_d0,(Type *)pCVar1,lhs,(Expression *)pSVar6,
                         (ASTContext *)local_120,opRange_06,(DiagCode)0xbb0007,true,extraDiagArg);
        }
      }
    }
  }
  return &local_110->super_Expression;
}

Assistant:

Expression& BinaryExpression::fromComponents(Expression& lhs, Expression& rhs, BinaryOperator op,
                                             SourceRange opRange, SourceRange sourceRange,
                                             const ASTContext& context) {
    auto& compilation = context.getCompilation();
    const Type* lt = lhs.type;
    const Type* rt = rhs.type;

    auto result = compilation.emplace<BinaryExpression>(op, *lt, lhs, rhs, sourceRange, opRange);
    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lt->isUnbounded())
        lt = &compilation.getIntType();
    if (rt->isUnbounded())
        rt = &compilation.getIntType();

    bool bothIntegral = lt->isIntegral() && rt->isIntegral();
    bool bothNumeric = lt->isNumeric() && rt->isNumeric();
    bool bothStrings = lhs.isImplicitString() && rhs.isImplicitString();

    auto forceFourState = [](Compilation& compilation, const Type* forceType) {
        if (forceType->isFloating() || forceType->isFourState())
            return forceType;

        // Use the logic in binaryOperatorType to create a type with the correct size and sign.
        return OpInfo::binaryType(compilation, forceType, forceType, true);
    };

    auto singleBitType = [](Compilation& compilation, const Type* lt, const Type* rt) {
        if (lt->isFourState() || rt->isFourState())
            return &compilation.getLogicType();
        return &compilation.getBitType();
    };

    bool good = false;
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
            good = bothNumeric;
            result->type = OpInfo::binaryType(compilation, lt, rt, false);
            break;
        case BinaryOperator::Divide:
            // Result is forced to 4-state because result can be X.
            good = bothNumeric;
            result->type = OpInfo::binaryType(compilation, lt, rt, true);
            break;
        case BinaryOperator::Mod:
            // Result is forced to 4-state because result can be X.
            // Different from divide because only integers are allowed.
            good = bothIntegral;
            result->type = OpInfo::binaryType(compilation, lt, rt, true);
            break;
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            good = bothIntegral;
            result->type = OpInfo::binaryType(compilation, lt, rt, false);
            break;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
            // The result is always the same type as the lhs, except that if the rhs is
            // four state then the lhs also becomes four state.
            good = bothIntegral;
            if (rt->isFourState())
                result->type = forceFourState(compilation, lt);
            else
                result->type = lt;
            selfDetermined(context, result->right_);
            break;
        case BinaryOperator::Power:
            good = bothNumeric;
            if (lt->isFloating() || rt->isFloating()) {
                result->type = OpInfo::binaryType(compilation, lt, rt, false);
                contextDetermined(context, result->right_, result, *result->type, opRange);
            }
            else {
                // Result is forced to 4-state because result can be X.
                result->type = forceFourState(compilation, lt);
                selfDetermined(context, result->right_);
            }
            break;
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan: {
            // Result is always a single bit.
            good = bothNumeric || bothStrings;
            result->type = singleBitType(compilation, lt, rt);

            // Result type is fixed but the two operands affect each other as they would in
            // other context-determined operators.
            auto nt = (good && !bothNumeric) ? &compilation.getStringType()
                                             : OpInfo::binaryType(compilation, lt, rt, false);
            contextDetermined(context, result->left_, result, *nt, opRange);
            contextDetermined(context, result->right_, result, *nt, opRange);
            break;
        }
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            // Result is always a single bit.
            good = bothNumeric;
            result->type = singleBitType(compilation, lt, rt);
            selfDetermined(context, result->left_);
            selfDetermined(context, result->right_);
            if (good) {
                // Call this just to get warnings about boolean conversions.
                context.requireBooleanConvertible(*result->left_);
                context.requireBooleanConvertible(*result->right_);
            }
            break;
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
            // Two types are comparable if:
            // - they are both integral or floating
            // - both classes or null, and assignment compatible
            // - both chandles or null
            // - both aggregates and equivalent
            if (bothNumeric) {
                // For equality and inequality, result is four state if either operand is
                // four state. For case equality and case inequality, result is never four
                // state. For wildcard equality / inequality, result is four state only if
                // lhs is four state.
                if (op == BinaryOperator::Equality || op == BinaryOperator::Inequality) {
                    good = true;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if (op == BinaryOperator::CaseEquality ||
                         op == BinaryOperator::CaseInequality) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = bothIntegral;
                    result->type = lt->isFourState() ? &compilation.getLogicType()
                                                     : &compilation.getBitType();
                }

                // Result type is fixed but the two operands affect each other as they would
                // in other context-determined operators.
                auto nt = OpInfo::binaryType(compilation, lt, rt, false);
                contextDetermined(context, result->left_, result, *nt, opRange);
                contextDetermined(context, result->right_, result, *nt, opRange);
            }
            else {
                bool isContext = false;
                bool isWildcard = op == BinaryOperator::WildcardEquality ||
                                  op == BinaryOperator::WildcardInequality;

                if (bothStrings) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();

                    // If there is a literal involved, make sure it's converted to string.
                    isContext = true;
                    contextDetermined(context, result->left_, result, compilation.getStringType(),
                                      opRange);
                    contextDetermined(context, result->right_, result, compilation.getStringType(),
                                      opRange);
                }
                else if (lt->isAggregate() && lt->isEquivalent(*rt)) {
                    good = !isWildcard;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if ((lt->isClass() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isClass() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCHandle() || lt->isNull()) && (rt->isCHandle() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isEvent() || lt->isNull()) && (rt->isEvent() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCovergroup() || lt->isNull()) &&
                         (rt->isCovergroup() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isVirtualInterface() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isVirtualInterface() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if (lt->isTypeRefType() && rt->isTypeRefType()) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = false;
                }

                if (!isContext) {
                    selfDetermined(context, result->left_);
                    selfDetermined(context, result->right_);
                }
            }
            break;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadBinaryExpression, opRange);
        diag << *lt << *rt;
        diag << lhs.sourceRange;
        diag << rhs.sourceRange;
        return badExpr(compilation, result);
    }

    analyzePrecedence(context, lhs, rhs, op, opRange);

    auto& clt = lt->getCanonicalType();
    auto& crt = rt->getCanonicalType();
    if (!clt.isMatching(crt)) {
        auto checkTypes = [&](DiagCode code, bool isComparison) {
            analyzeOpTypes(clt, crt, *lt, *rt, lhs, rhs, context, opRange, code, isComparison, {});
        };

        switch (op) {
            case BinaryOperator::Add:
            case BinaryOperator::Subtract:
            case BinaryOperator::Multiply:
            case BinaryOperator::Divide:
            case BinaryOperator::Mod:
                checkTypes(diag::ArithOpMismatch, false);
                break;
            case BinaryOperator::BinaryAnd:
            case BinaryOperator::BinaryOr:
            case BinaryOperator::BinaryXor:
            case BinaryOperator::BinaryXnor:
                checkTypes(diag::BitwiseOpMismatch, false);
                break;
            case BinaryOperator::Equality:
            case BinaryOperator::Inequality:
            case BinaryOperator::CaseEquality:
            case BinaryOperator::CaseInequality:
            case BinaryOperator::GreaterThanEqual:
            case BinaryOperator::GreaterThan:
            case BinaryOperator::LessThanEqual:
            case BinaryOperator::LessThan:
            case BinaryOperator::WildcardEquality:
            case BinaryOperator::WildcardInequality:
                checkTypes(diag::ComparisonMismatch, true);
                break;
            default:
                // Remaining operations have self determined
                // operands so the warning wouldn't make sense.
                break;
        }
    }

    return *result;
}